

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::TypedModeFunction<duckdb::ModeStandard<int>>::
     ConstantOperation<int,duckdb::ModeState<int,duckdb::ModeStandard<int>>,duckdb::EntropyFunction<duckdb::ModeStandard<int>>>
               (ModeState<int,_duckdb::ModeStandard<int>_> *state,int *key,
               AggregateUnaryInput *aggr_input,idx_t count)

{
  MAP_TYPE *pMVar1;
  mapped_type *pmVar2;
  unsigned_long uVar3;
  ArenaAllocator *in_RCX;
  long in_RDI;
  mapped_type *i;
  key_type *in_stack_ffffffffffffffd8;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    pMVar1 = ModeStandard<int>::CreateEmpty(in_RCX);
    *(MAP_TYPE **)(in_RDI + 0x18) = pMVar1;
  }
  pmVar2 = std::
           unordered_map<int,_duckdb::ModeAttr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>_>
           ::operator[]((unordered_map<int,_duckdb::ModeAttr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_duckdb::ModeAttr>_>_>
                         *)in_RCX,in_stack_ffffffffffffffd8);
  pmVar2->count = (size_t)(in_RCX + pmVar2->count);
  uVar3 = MinValue<unsigned_long>(pmVar2->first_row,*(unsigned_long *)(in_RDI + 0x38));
  pmVar2->first_row = uVar3;
  *(ArenaAllocator **)(in_RDI + 0x38) = in_RCX + *(long *)(in_RDI + 0x38);
  return;
}

Assistant:

static void ConstantOperation(STATE &state, const INPUT_TYPE &key, AggregateUnaryInput &aggr_input, idx_t count) {
		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(aggr_input.input.allocator);
		}
		auto &i = (*state.frequency_map)[key];
		i.count += count;
		i.first_row = MinValue<idx_t>(i.first_row, state.count);
		state.count += count;
	}